

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

int pulse_stream_set_volume(cubeb_stream_conflict *stm,float volume)

{
  cubeb_conflict *ctx;
  pa_volume_t pVar1;
  uint32_t uVar2;
  pa_sample_spec *ppVar3;
  pa_operation *o;
  pa_cvolume cvol;
  
  if (stm->output_stream != (pa_stream *)0x0) {
    (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
    ctx = stm->context;
    if ((ctx->default_sink_info == (cubeb_default_sink_info *)0x0) ||
       ((ctx->default_sink_info->flags & PA_SINK_FLAT_VOLUME) == PA_SINK_NOFLAGS)) {
      ppVar3 = (*cubeb_pa_stream_get_sample_spec)(stm->output_stream);
      pVar1 = (*cubeb_pa_sw_volume_from_linear)((double)volume);
      (*cubeb_pa_cvolume_set)(&cvol,(uint)ppVar3->channels,pVar1);
      uVar2 = (*cubeb_pa_stream_get_index)(stm->output_stream);
      o = (*cubeb_pa_context_set_sink_input_volume)(ctx->context,uVar2,&cvol,volume_success,stm);
      if (o != (pa_operation *)0x0) {
        operation_wait(ctx,stm->output_stream,o);
        (*cubeb_pa_operation_unref)(o);
      }
    }
    else {
      stm->volume = volume;
    }
    (*cubeb_pa_threaded_mainloop_unlock)(ctx->mainloop);
    return 0;
  }
  return -1;
}

Assistant:

static int
pulse_stream_set_volume(cubeb_stream * stm, float volume)
{
  uint32_t index;
  pa_operation * op;
  pa_volume_t vol;
  pa_cvolume cvol;
  const pa_sample_spec * ss;
  cubeb * ctx;

  if (!stm->output_stream) {
    return CUBEB_ERROR;
  }

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);

  /* if the pulse daemon is configured to use flat volumes,
   * apply our own gain instead of changing the input volume on the sink. */
  ctx = stm->context;
  if (ctx->default_sink_info &&
      (ctx->default_sink_info->flags & PA_SINK_FLAT_VOLUME)) {
    stm->volume = volume;
  } else {
    ss = WRAP(pa_stream_get_sample_spec)(stm->output_stream);

    vol = WRAP(pa_sw_volume_from_linear)(volume);
    WRAP(pa_cvolume_set)(&cvol, ss->channels, vol);

    index = WRAP(pa_stream_get_index)(stm->output_stream);

    op = WRAP(pa_context_set_sink_input_volume)(ctx->context, index, &cvol,
                                                volume_success, stm);
    if (op) {
      operation_wait(ctx, stm->output_stream, op);
      WRAP(pa_operation_unref)(op);
    }
  }

  WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);

  return CUBEB_OK;
}